

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall spdlog::spdlog_ex::~spdlog_ex(spdlog_ex *this)

{
  spdlog_ex *this_local;
  
  ~spdlog_ex(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

class SPDLOG_API spdlog_ex : public std::exception {
public:
    explicit spdlog_ex(std::string msg);
    spdlog_ex(const std::string &msg, int last_errno);
    const char *what() const SPDLOG_NOEXCEPT override;

private:
    std::string msg_;
}